

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O2

void luaL_setfuncs(lua_State *L,luaL_Reg *l,int nup)

{
  int iVar1;
  int iVar2;
  
  luaL_checkstack(L,nup,"too many upvalues");
  iVar2 = 0;
  if (0 < nup) {
    iVar2 = nup;
  }
  for (; iVar1 = iVar2, l->name != (char *)0x0; l = l + 1) {
    while (iVar1 != 0) {
      lua_pushvalue(L,-nup);
      iVar1 = iVar1 + -1;
    }
    lua_pushcclosure(L,l->func,nup);
    lua_setfield(L,-2 - nup,l->name);
  }
  lua_settop(L,~nup);
  return;
}

Assistant:

LUALIB_API void luaL_setfuncs(lua_State *L, const luaL_Reg *l, int nup) {
    luaL_checkstack(L, nup, "too many upvalues");
    for (; l->name != NULL; l++) {  /* fill the table with given functions */
        int i;
        for (i = 0; i < nup; i++)  /* copy upvalues to the top */
            lua_pushvalue(L, -nup);
        lua_pushcclosure(L, l->func, nup);  /* closure with those upvalues */
        lua_setfield(L, -(nup + 2), l->name);
    }
    lua_pop(L, nup);  /* remove upvalues */
}